

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O0

ssize_t __thiscall KmerCounter::write(KmerCounter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  ofstream *ofs;
  ofstream count_file;
  ofstream *in_stack_fffffffffffffd78;
  KmerCounter *this_00;
  pointer in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  undefined1 local_240 [528];
  string local_30 [32];
  ofstream *local_10;
  KmerCounter *local_8;
  
  ofs = (ofstream *)CONCAT44(in_register_00000034,__fd);
  local_10 = ofs;
  local_8 = this;
  std::operator+(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
  sdglib::write_string(ofs,(string *)this);
  std::__cxx11::string::~string(local_30);
  this_00 = (KmerCounter *)&stack0xfffffffffffffda0;
  std::operator+(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
  std::ofstream::ofstream(local_240,(string *)this_00,_S_out);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffda0);
  write_counts(this_00,in_stack_fffffffffffffd78);
  sVar1 = std::ofstream::~ofstream(local_240);
  return sVar1;
}

Assistant:

void KmerCounter::write(std::ofstream &output_file) const {
    sdglib::write_string(output_file, name+".sdgkc");
    std::ofstream count_file(name+".sdgkc");
    write_counts(count_file);
}